

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O2

S2Cap * __thiscall
S2MinDistanceShapeIndexTarget::GetCapBound
          (S2Cap *__return_storage_ptr__,S2MinDistanceShapeIndexTarget *this)

{
  S2ShapeIndexRegion<S2ShapeIndex> SStack_38;
  
  S2ShapeIndexRegion<S2ShapeIndex>::S2ShapeIndexRegion(&SStack_38,this->index_);
  S2ShapeIndexRegion<S2ShapeIndex>::GetCapBound(__return_storage_ptr__,&SStack_38);
  if (SStack_38.contains_query_.it_.iter_._M_t.
      super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      ._M_t.
      super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl !=
      (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)SStack_38.contains_query_.it_.iter_._M_t.
                          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl +
                8))();
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2MinDistanceShapeIndexTarget::GetCapBound() {
  return MakeS2ShapeIndexRegion(index_).GetCapBound();
}